

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall QMenu::hideEvent(QMenu *this,QHideEvent *param_1)

{
  QMenuPrivate *this_00;
  Data *pDVar1;
  long lVar2;
  QObject *menu;
  long in_FS_OFFSET;
  code *local_40;
  undefined8 local_38;
  QMenu *pQStack_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  QMetaObject::activate((QObject *)this,&staticMetaObject,1,(void **)0x0);
  if (this_00->eventLoop != (QEventLoop *)0x0) {
    QEventLoop::exit((int)this_00->eventLoop);
  }
  QMenuPrivate::setCurrentAction(this_00,(QAction *)0x0,-1,SelectedFromElsewhere,false);
  local_40 = QFont::strikeOut;
  local_38 = 0xaaaaaaaa00000007;
  local_28 = 0xaaaaaaaaffffffff;
  pQStack_30 = this;
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_40);
  lVar2 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
  if (lVar2 != 0) {
    QMenuBarPrivate::setCurrentAction(*(QMenuBarPrivate **)(lVar2 + 8),(QAction *)0x0,false,false);
  }
  if (QMenuPrivate::mouseDown == this) {
    QMenuPrivate::mouseDown = (QMenu *)0x0;
  }
  this_00->field_0x420 = this_00->field_0x420 & 0x7f;
  pDVar1 = (this_00->activeMenu).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     (menu = (this_00->activeMenu).wp.value, menu != (QObject *)0x0)) {
    if (*(int *)(pDVar1 + 4) == 0) {
      menu = (QObject *)0x0;
    }
    QMenuPrivate::hideMenu(this_00,(QMenu *)menu);
  }
  pDVar1 = (this_00->causedPopup).widget.wp.d;
  (this_00->causedPopup).widget.wp.d = (Data *)0x0;
  (this_00->causedPopup).widget.wp.value = (QObject *)0x0;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if (*(int *)pDVar1 == 0) {
      operator_delete(pDVar1);
    }
  }
  pDVar1 = (this_00->causedPopup).action.wp.d;
  (this_00->causedPopup).action.wp.d = (Data *)0x0;
  (this_00->causedPopup).action.wp.value = (QObject *)0x0;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if (*(int *)pDVar1 == 0) {
      operator_delete(pDVar1);
    }
  }
  if (this_00->scroll != (QMenuScroller *)0x0) {
    QBasicTimer::stop();
  }
  QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenu::hideEvent(QHideEvent *)
{
    Q_D(QMenu);
    emit aboutToHide();
    if (d->eventLoop)
        d->eventLoop->exit();
    d->setCurrentAction(nullptr);
#if QT_CONFIG(accessibility)
    QAccessibleEvent event(this, QAccessible::PopupMenuEnd);
    QAccessible::updateAccessibility(&event);
#endif
#if QT_CONFIG(menubar)
    if (QMenuBar *mb = qobject_cast<QMenuBar*>(d->causedPopup.widget))
        mb->d_func()->setCurrentAction(nullptr);
#endif
    if (QMenuPrivate::mouseDown == this)
        QMenuPrivate::mouseDown = nullptr;
    d->hasHadMouse = false;
    if (d->activeMenu)
        d->hideMenu(d->activeMenu);
    d->causedPopup.widget = nullptr;
    d->causedPopup.action = nullptr;
    if (d->scroll)
        d->scroll->scrollTimer.stop(); //make sure the timer stops
}